

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_lib_config(int nConfigOp,...)

{
  int iVar1;
  va_list ap;
  
  if (sJx9MPGlobal.nMagic == 0xea1495ba) {
    return -4;
  }
  iVar1 = (*(code *)(&DAT_001398bc + *(int *)(&DAT_001398bc + (ulong)(nConfigOp - 1) * 4)))();
  return iVar1;
}

Assistant:

JX9_PRIVATE int jx9_lib_config(int nConfigOp, ...)
{
	va_list ap;
	int rc;
	if( sJx9MPGlobal.nMagic == JX9_LIB_MAGIC ){
		/* Library is already initialized, this operation is forbidden */
		return JX9_LOOKED;
	}
	va_start(ap, nConfigOp);
	rc = Jx9CoreConfigure(nConfigOp, ap);
	va_end(ap);
	return rc;
}